

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O1

size_t license::mstrlcpy(char *dst,char *src,size_t n)

{
  long lVar1;
  size_t n_orig;
  
  if (n == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = n - 1;
    if (lVar1 != 0) {
      do {
        if (*src == '\0') goto LAB_0018cfdd;
        *dst = *src;
        dst = dst + 1;
        src = src + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
      lVar1 = 0;
    }
LAB_0018cfdd:
    *dst = '\0';
  }
  return n - lVar1;
}

Assistant:

size_t mstrlcpy(char *dst, const char *src, size_t n) {
	size_t n_orig = n;
	if (n > 0) {
		char *pd;
		const char *ps;

		for (--n, pd = dst, ps = src; n > 0 && *ps != '\0'; --n, ++pd, ++ps) *pd = *ps;

		*pd = '\0';
	}

	return n_orig - n;
}